

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmimeprovider.cpp
# Opt level: O1

void __thiscall
QMimeXMLProvider::addAliases(QMimeXMLProvider *this,QString *name,QStringList *result)

{
  Entry *pEVar1;
  long lVar2;
  long lVar3;
  piter pVar4;
  bool bVar5;
  ulong uVar6;
  CaseSensitivity in_R8D;
  ulong uVar7;
  uchar *args;
  Data<QHashPrivate::Node<QString,_QString>_> *pDVar8;
  long in_FS_OFFSET;
  QStringView rhs;
  QStringView str;
  piter pVar9;
  QStringView lhs;
  QKeyValueRange<const_QHash<QString,_QString>_&> local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_40.super_QKeyValueRangeStorage<const_QHash<QString,_QString>_&>.m_map =
       (QKeyValueRangeStorage<const_QHash<QString,_QString>_&>)&this->m_aliases;
  pVar9 = (piter)QtPrivate::QKeyValueRange<const_QHash<QString,_QString>_&>::begin(&local_40);
  if (pVar9.d != (Data<QHashPrivate::Node<QString,_QString>_> *)0x0 || pVar9.bucket != 0) {
    do {
      uVar7 = pVar9.bucket;
      pDVar8 = pVar9.d;
      pEVar1 = pDVar8->spans[uVar7 >> 7].entries;
      uVar6 = (ulong)((uint)pDVar8->spans[uVar7 >> 7].offsets[(uint)pVar9.bucket & 0x7f] * 0x30);
      lVar2 = *(long *)((pEVar1->storage).data + uVar6 + 0x28);
      lVar3 = (name->d).size;
      if ((lVar2 == lVar3) &&
         (rhs.m_data = (name->d).ptr, rhs.m_size = lVar3,
         lhs.m_data = *(storage_type_conflict **)((pEVar1->storage).data + uVar6 + 0x20),
         lhs.m_size = lVar2, bVar5 = QtPrivate::equalStrings(lhs,rhs), bVar5)) {
        args = (pEVar1->storage).data + uVar6;
        str.m_data = (storage_type_conflict *)0x1;
        str.m_size = (qsizetype)*(char16_t **)(args + 8);
        bVar5 = QtPrivate::QStringList_contains
                          ((QtPrivate *)result,*(QStringList **)(args + 0x10),str,in_R8D);
        if (!bVar5) {
          QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
                    ((QMovableArrayOps<QString> *)result,(result->d).size,(QString *)args);
          QList<QString>::end(result);
        }
      }
      do {
        if (pDVar8->numBuckets - 1 == uVar7) {
          uVar7 = 0;
          pDVar8 = (Data<QHashPrivate::Node<QString,_QString>_> *)0x0;
          break;
        }
        uVar7 = uVar7 + 1;
      } while (pDVar8->spans[uVar7 >> 7].offsets[(uint)uVar7 & 0x7f] == 0xff);
      pVar4.bucket = uVar7;
      pVar4.d = pDVar8;
      pVar9.bucket = uVar7;
      pVar9.d = pDVar8;
    } while ((pDVar8 != (Data<QHashPrivate::Node<QString,_QString>_> *)0x0) ||
            (pVar9 = pVar4, uVar7 != 0));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QMimeXMLProvider::addAliases(const QString &name, QStringList &result)
{
    // Iterate through the whole hash. This method is rarely used.
    for (const auto &[alias, mimeName] : std::as_const(m_aliases).asKeyValueRange()) {
        if (mimeName == name)
            appendIfNew(result, alias);
    }
}